

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O3

int main(void)

{
  int iVar1;
  char *in_RCX;
  int family;
  int sock;
  int sock_00;
  int family_00;
  int sock_01;
  int sock_02;
  long lVar2;
  int iVar3;
  nn_thread threads [100];
  nn_thread local_988 [100];
  
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = test_socket_impl((char *)0x5d,0x20,family,(int)in_RCX);
  test_bind_impl((char *)0x5e,iVar1,sock,in_RCX);
  iVar3 = 0;
  do {
    lVar2 = 0;
    do {
      nn_thread_init((nn_thread *)((long)&local_988[0].routine + lVar2),routine,(void *)0x0);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x960);
    lVar2 = 0;
    do {
      nn_thread_term((nn_thread *)((long)&local_988[0].routine + lVar2));
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x960);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  test_close_impl((char *)0x67,iVar1,sock_00);
  iVar1 = test_socket_impl((char *)0x6b,0x50,family_00,(int)in_RCX);
  test_bind_impl((char *)0x6c,iVar1,sock_01,in_RCX);
  iVar3 = 0;
  do {
    lVar2 = 0;
    do {
      nn_thread_init((nn_thread *)((long)&local_988[0].routine + lVar2),routine2,(void *)0x0);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0xf0);
    active = 10;
    while (active != 0) {
      nn_send(iVar1,"hello",5,1);
      nn_sleep(0);
    }
    lVar2 = 0;
    do {
      nn_thread_term((nn_thread *)((long)&local_988[0].routine + lVar2));
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0xf0);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  test_close_impl((char *)0x7c,iVar1,sock_02);
  return 0;
}

Assistant:

int main ()
{

#ifndef NN_HAVE_WSL
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

#if defined(SIGPIPE) && defined(SIG_IGN)
	signal (SIGPIPE, SIG_IGN);
#endif

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    /*  Test race condition of sending message while socket shutting down  */

    sb = test_socket (AF_SP, NN_PUSH);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine2, NULL);
        active = TEST2_THREAD_COUNT;

        while (active) {
            (void) nn_send (sb, "hello", 5, NN_DONTWAIT);
            nn_sleep (0);
        }

        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);
#endif /* NN_HAVE_WSL */

    return 0;
}